

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  short sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  int iVar9;
  parasail_result_t *ppVar10;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  parasail_matrix_t *ppVar15;
  char *pcVar16;
  int16_t iVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  int32_t segNum;
  long lVar22;
  char *__format;
  long lVar23;
  long lVar24;
  ulong uVar25;
  ulong size;
  long lVar26;
  bool bVar27;
  undefined4 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128i alVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  undefined1 auVar47 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ushort uVar58;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  undefined1 auVar60 [16];
  ushort uVar67;
  __m128i_16_t e;
  __m128i_16_t h;
  short sVar28;
  short sVar33;
  short sVar46;
  short sVar59;
  short sVar68;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar16 = "profile";
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar16 = "profile->profile16.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar16 = "profile->matrix";
      }
      else {
        uVar12 = profile->s1Len;
        if ((int)uVar12 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar16 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar16 = "open";
        }
        else {
          if (-1 < gap) {
            uVar21 = uVar12 - 1;
            size = (ulong)uVar12 + 7 >> 3;
            iVar18 = -open;
            iVar14 = ppVar4->min;
            iVar13 = -iVar14;
            if (iVar14 != iVar18 && SBORROW4(iVar14,iVar18) == iVar14 + open < 0) {
              iVar13 = open;
            }
            iVar9 = ppVar4->max;
            ppVar15 = ppVar4;
            ppVar10 = parasail_result_new();
            uVar29 = SUB84(ppVar15,0);
            if (ppVar10 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            ppVar10->flag = ppVar10->flag | 0x8200401;
            ptr = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,size);
            ptr_02 = parasail_memalign___m128i(0x10,size);
            ptr_03 = parasail_memalign___m128i(0x10,size);
            auVar30._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
            auVar30._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
            auVar30._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
            auVar30._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
            iVar11 = movmskps(uVar29,auVar30);
            if (iVar11 != 0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_03 != (__m128i *)0x0) {
              iVar11 = s2Len + -1;
              auVar30 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar29 = auVar30._0_4_;
              auVar36._4_4_ = uVar29;
              auVar36._0_4_ = uVar29;
              auVar36._8_4_ = uVar29;
              auVar36._12_4_ = uVar29;
              auVar30 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar29 = auVar30._0_4_;
              uVar12 = iVar13 - 0x7fff;
              auVar30 = pshuflw(ZEXT416(uVar12),ZEXT416(uVar12),0);
              auVar31._0_4_ = auVar30._0_4_;
              auVar31._4_4_ = auVar31._0_4_;
              auVar31._8_4_ = auVar31._0_4_;
              auVar31._12_4_ = auVar31._0_4_;
              auVar34 = ZEXT416(CONCAT22((short)((uint)iVar14 >> 0x10),0x7ffe - (short)iVar9));
              auVar35 = pshuflw(auVar34,auVar34,0);
              auVar34._0_4_ = auVar35._0_4_;
              auVar34._4_4_ = auVar34._0_4_;
              auVar34._8_4_ = auVar34._0_4_;
              auVar34._12_4_ = auVar34._0_4_;
              iVar14 = (int)size;
              auVar37 = pshuflw(ZEXT416((uint)-(iVar14 * gap)),ZEXT416((uint)-(iVar14 * gap)),0);
              uVar19 = auVar37._0_4_;
              auVar37._0_8_ = CONCAT44(uVar19,uVar19);
              auVar37._8_4_ = uVar19;
              auVar37._12_4_ = uVar19;
              auVar38._0_8_ = auVar37._0_8_ << 0x10;
              auVar38._8_8_ = auVar37._8_8_ << 0x10 | (ulong)(uVar19 >> 0x10);
              auVar37 = paddsw(auVar38,ZEXT416(uVar12 & 0xffff));
              lVar20 = (long)iVar18;
              for (uVar25 = 0; uVar25 != size; uVar25 = uVar25 + 1) {
                lVar24 = lVar20;
                for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
                  lVar26 = -0x8000;
                  if (-0x8000 < lVar24) {
                    lVar26 = lVar24;
                  }
                  lVar23 = lVar24 - (ulong)(uint)open;
                  if (lVar23 < -0x7fff) {
                    lVar23 = -0x8000;
                  }
                  *(short *)((long)&h + lVar22 * 2) = (short)lVar26;
                  *(short *)((long)&e + lVar22 * 2) = (short)lVar23;
                  lVar24 = lVar24 - size * (uint)gap;
                }
                ptr_02[uVar25][0] = h.m[0];
                ptr_02[uVar25][1] = h.m[1];
                ptr[uVar25][0] = e.m[0];
                ptr[uVar25][1] = e.m[1];
                lVar20 = lVar20 - (ulong)(uint)gap;
              }
              *ptr_00 = 0;
              for (uVar25 = 1; s2Len + 1 != uVar25; uVar25 = uVar25 + 1) {
                iVar17 = -0x8000;
                if (-0x8000 < iVar18) {
                  iVar17 = (int16_t)iVar18;
                }
                ptr_00[uVar25] = iVar17;
                iVar18 = iVar18 - gap;
              }
              alVar39 = (__m128i)psubsw((undefined1  [16])0x0,auVar36);
              for (uVar19 = iVar14 - 1U; -1 < (int)uVar19; uVar19 = uVar19 - 1) {
                ptr_03[uVar19] = alVar39;
                auVar54._4_4_ = uVar29;
                auVar54._0_4_ = uVar29;
                auVar54._8_4_ = uVar29;
                auVar54._12_4_ = uVar29;
                alVar39 = (__m128i)psubsw((undefined1  [16])alVar39,auVar54);
              }
              uVar25 = 0;
              auVar38 = auVar31;
              while (uVar25 != (uint)s2Len) {
                uVar8 = ptr_02[iVar14 - 1U][0];
                auVar44._8_8_ = ptr_02[iVar14 - 1U][1] << 0x10 | uVar8 >> 0x30;
                auVar44._0_8_ = uVar8 << 0x10 | (ulong)(ushort)ptr_00[uVar25];
                iVar13 = ppVar4->mapper[(byte)s2[uVar25]];
                auVar43 = psubsw(auVar31,(undefined1  [16])*ptr_03);
                lVar20 = 0;
                auVar57 = auVar31;
                while( true ) {
                  sVar28 = auVar57._0_2_;
                  sVar33 = auVar57._2_2_;
                  sVar46 = auVar57._4_2_;
                  sVar48 = auVar57._6_2_;
                  sVar49 = auVar57._8_2_;
                  sVar50 = auVar57._10_2_;
                  sVar51 = auVar57._12_2_;
                  sVar52 = auVar57._14_2_;
                  if (size << 4 == lVar20) break;
                  auVar54 = *(undefined1 (*) [16])((long)*ptr_02 + lVar20);
                  auVar6._4_4_ = uVar29;
                  auVar6._0_4_ = uVar29;
                  auVar6._8_4_ = uVar29;
                  auVar6._12_4_ = uVar29;
                  auVar57 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar20),auVar6);
                  auVar60 = psubsw(auVar54,auVar36);
                  auVar53 = paddsw(auVar44,*(undefined1 (*) [16])
                                            ((long)pvVar3 + lVar20 + (long)(iVar13 * iVar14) * 0x10)
                                  );
                  auVar44 = paddsw(auVar43,*(undefined1 (*) [16])((long)*ptr_03 + lVar20));
                  sVar5 = auVar57._0_2_;
                  sVar59 = auVar60._0_2_;
                  uVar58 = (ushort)(sVar59 < sVar5) * sVar5 | (ushort)(sVar59 >= sVar5) * sVar59;
                  sVar5 = auVar57._2_2_;
                  sVar59 = auVar60._2_2_;
                  uVar61 = (ushort)(sVar59 < sVar5) * sVar5 | (ushort)(sVar59 >= sVar5) * sVar59;
                  sVar5 = auVar57._4_2_;
                  sVar59 = auVar60._4_2_;
                  uVar62 = (ushort)(sVar59 < sVar5) * sVar5 | (ushort)(sVar59 >= sVar5) * sVar59;
                  sVar5 = auVar57._6_2_;
                  sVar59 = auVar60._6_2_;
                  uVar63 = (ushort)(sVar59 < sVar5) * sVar5 | (ushort)(sVar59 >= sVar5) * sVar59;
                  sVar5 = auVar57._8_2_;
                  sVar59 = auVar60._8_2_;
                  uVar64 = (ushort)(sVar59 < sVar5) * sVar5 | (ushort)(sVar59 >= sVar5) * sVar59;
                  sVar5 = auVar57._10_2_;
                  sVar59 = auVar60._10_2_;
                  uVar65 = (ushort)(sVar59 < sVar5) * sVar5 | (ushort)(sVar59 >= sVar5) * sVar59;
                  sVar5 = auVar57._12_2_;
                  sVar59 = auVar60._12_2_;
                  sVar68 = auVar60._14_2_;
                  uVar66 = (ushort)(sVar59 < sVar5) * sVar5 | (ushort)(sVar59 >= sVar5) * sVar59;
                  sVar5 = auVar57._14_2_;
                  uVar67 = (ushort)(sVar68 < sVar5) * sVar5 | (ushort)(sVar68 >= sVar5) * sVar68;
                  sVar5 = auVar44._0_2_;
                  auVar57._0_2_ =
                       (ushort)(sVar28 < sVar5) * sVar5 | (ushort)(sVar28 >= sVar5) * sVar28;
                  sVar28 = auVar44._2_2_;
                  auVar57._2_2_ =
                       (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                  sVar28 = auVar44._4_2_;
                  auVar57._4_2_ =
                       (ushort)(sVar46 < sVar28) * sVar28 | (ushort)(sVar46 >= sVar28) * sVar46;
                  sVar28 = auVar44._6_2_;
                  auVar57._6_2_ =
                       (ushort)(sVar48 < sVar28) * sVar28 | (ushort)(sVar48 >= sVar28) * sVar48;
                  sVar28 = auVar44._8_2_;
                  auVar57._8_2_ =
                       (ushort)(sVar49 < sVar28) * sVar28 | (ushort)(sVar49 >= sVar28) * sVar49;
                  sVar28 = auVar44._10_2_;
                  auVar57._10_2_ =
                       (ushort)(sVar50 < sVar28) * sVar28 | (ushort)(sVar50 >= sVar28) * sVar50;
                  sVar28 = auVar44._12_2_;
                  auVar57._12_2_ =
                       (ushort)(sVar51 < sVar28) * sVar28 | (ushort)(sVar51 >= sVar28) * sVar51;
                  sVar28 = auVar44._14_2_;
                  auVar57._14_2_ =
                       (ushort)(sVar52 < sVar28) * sVar28 | (ushort)(sVar52 >= sVar28) * sVar52;
                  sVar28 = auVar53._0_2_;
                  auVar43._0_2_ =
                       (sVar28 < (short)uVar58) * uVar58 |
                       (ushort)(sVar28 >= (short)uVar58) * sVar28;
                  sVar28 = auVar53._2_2_;
                  auVar43._2_2_ =
                       (sVar28 < (short)uVar61) * uVar61 |
                       (ushort)(sVar28 >= (short)uVar61) * sVar28;
                  sVar28 = auVar53._4_2_;
                  auVar43._4_2_ =
                       (sVar28 < (short)uVar62) * uVar62 |
                       (ushort)(sVar28 >= (short)uVar62) * sVar28;
                  sVar28 = auVar53._6_2_;
                  auVar43._6_2_ =
                       (sVar28 < (short)uVar63) * uVar63 |
                       (ushort)(sVar28 >= (short)uVar63) * sVar28;
                  sVar28 = auVar53._8_2_;
                  auVar43._8_2_ =
                       (sVar28 < (short)uVar64) * uVar64 |
                       (ushort)(sVar28 >= (short)uVar64) * sVar28;
                  sVar28 = auVar53._10_2_;
                  auVar43._10_2_ =
                       (sVar28 < (short)uVar65) * uVar65 |
                       (ushort)(sVar28 >= (short)uVar65) * sVar28;
                  sVar28 = auVar53._12_2_;
                  sVar33 = auVar53._14_2_;
                  auVar43._12_2_ =
                       (sVar28 < (short)uVar66) * uVar66 |
                       (ushort)(sVar28 >= (short)uVar66) * sVar28;
                  auVar43._14_2_ =
                       (sVar33 < (short)uVar67) * uVar67 |
                       (ushort)(sVar33 >= (short)uVar67) * sVar33;
                  puVar1 = (ushort *)((long)*ptr + lVar20);
                  *puVar1 = uVar58;
                  puVar1[1] = uVar61;
                  puVar1[2] = uVar62;
                  puVar1[3] = uVar63;
                  puVar1[4] = uVar64;
                  puVar1[5] = uVar65;
                  puVar1[6] = uVar66;
                  puVar1[7] = uVar67;
                  *(undefined1 (*) [16])((long)*ptr_01 + lVar20) = auVar43;
                  lVar20 = lVar20 + 0x10;
                  auVar44 = auVar54;
                }
                auVar60._8_8_ = auVar43._8_8_ << 0x10 | auVar43._0_8_ >> 0x30;
                uVar58 = ptr_00[uVar25 + 1];
                auVar60._0_8_ = auVar43._0_8_ << 0x10 | (ulong)uVar58;
                uVar25 = uVar25 + 1;
                auVar54 = paddsw((undefined1  [16])*ptr_03,auVar60);
                sVar5 = auVar54._0_2_;
                auVar53._0_2_ =
                     (ushort)(sVar28 < sVar5) * sVar5 | (ushort)(sVar28 >= sVar5) * sVar28;
                sVar28 = auVar54._2_2_;
                auVar53._2_2_ =
                     (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                sVar28 = auVar54._4_2_;
                auVar53._4_2_ =
                     (ushort)(sVar46 < sVar28) * sVar28 | (ushort)(sVar46 >= sVar28) * sVar46;
                sVar28 = auVar54._6_2_;
                auVar53._6_2_ =
                     (ushort)(sVar48 < sVar28) * sVar28 | (ushort)(sVar48 >= sVar28) * sVar48;
                sVar28 = auVar54._8_2_;
                auVar53._8_2_ =
                     (ushort)(sVar49 < sVar28) * sVar28 | (ushort)(sVar49 >= sVar28) * sVar49;
                sVar28 = auVar54._10_2_;
                auVar53._10_2_ =
                     (ushort)(sVar50 < sVar28) * sVar28 | (ushort)(sVar50 >= sVar28) * sVar50;
                sVar28 = auVar54._12_2_;
                auVar53._12_2_ =
                     (ushort)(sVar51 < sVar28) * sVar28 | (ushort)(sVar51 >= sVar28) * sVar51;
                sVar28 = auVar54._14_2_;
                auVar53._14_2_ =
                     (ushort)(sVar52 < sVar28) * sVar28 | (ushort)(sVar52 >= sVar28) * sVar52;
                iVar13 = 6;
                while( true ) {
                  auVar55._0_8_ = auVar53._0_8_ << 0x10;
                  auVar55._8_8_ = auVar53._8_8_ << 0x10 | auVar53._0_8_ >> 0x30;
                  bVar27 = iVar13 == 0;
                  iVar13 = iVar13 + -1;
                  if (bVar27) break;
                  auVar54 = paddsw(auVar55,auVar37);
                  sVar28 = auVar54._0_2_;
                  sVar33 = auVar53._0_2_;
                  auVar47._0_2_ =
                       (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                  sVar28 = auVar54._2_2_;
                  sVar33 = auVar53._2_2_;
                  auVar47._2_2_ =
                       (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                  sVar28 = auVar54._4_2_;
                  sVar33 = auVar53._4_2_;
                  auVar47._4_2_ =
                       (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                  sVar28 = auVar54._6_2_;
                  sVar33 = auVar53._6_2_;
                  auVar47._6_2_ =
                       (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                  sVar28 = auVar54._8_2_;
                  sVar33 = auVar53._8_2_;
                  auVar47._8_2_ =
                       (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                  sVar28 = auVar54._10_2_;
                  sVar33 = auVar53._10_2_;
                  auVar47._10_2_ =
                       (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                  sVar28 = auVar54._12_2_;
                  sVar33 = auVar53._12_2_;
                  sVar46 = auVar53._14_2_;
                  auVar47._12_2_ =
                       (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                  sVar28 = auVar54._14_2_;
                  auVar47._14_2_ =
                       (ushort)(sVar46 < sVar28) * sVar28 | (ushort)(sVar46 >= sVar28) * sVar46;
                  auVar53 = auVar47;
                }
                auVar56 = paddsw(auVar55,ZEXT416(uVar12 & 0xffff));
                sVar28 = auVar56._0_2_;
                auVar45._0_2_ =
                     (ushort)((short)uVar58 < sVar28) * sVar28 | ((short)uVar58 >= sVar28) * uVar58;
                sVar28 = auVar56._2_2_;
                sVar33 = auVar43._0_2_;
                auVar45._2_2_ =
                     (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                sVar28 = auVar56._4_2_;
                sVar33 = auVar43._2_2_;
                auVar45._4_2_ =
                     (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                sVar28 = auVar56._6_2_;
                sVar33 = auVar43._4_2_;
                auVar45._6_2_ =
                     (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                sVar28 = auVar56._8_2_;
                sVar33 = auVar43._6_2_;
                auVar45._8_2_ =
                     (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                sVar28 = auVar56._10_2_;
                sVar33 = auVar43._8_2_;
                auVar45._10_2_ =
                     (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                sVar28 = auVar56._12_2_;
                sVar33 = auVar43._10_2_;
                sVar46 = auVar43._12_2_;
                auVar45._12_2_ =
                     (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                sVar28 = auVar56._14_2_;
                auVar45._14_2_ =
                     (ushort)(sVar46 < sVar28) * sVar28 | (ushort)(sVar46 >= sVar28) * sVar46;
                for (lVar20 = 0; size << 4 != lVar20; lVar20 = lVar20 + 0x10) {
                  auVar7._4_4_ = uVar29;
                  auVar7._0_4_ = uVar29;
                  auVar7._8_4_ = uVar29;
                  auVar7._12_4_ = uVar29;
                  auVar57 = psubsw(auVar56,auVar7);
                  auVar54 = psubsw(auVar45,auVar36);
                  sVar28 = auVar54._0_2_;
                  sVar33 = auVar57._0_2_;
                  auVar56._0_2_ =
                       (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                  sVar28 = auVar54._2_2_;
                  sVar33 = auVar57._2_2_;
                  auVar56._2_2_ =
                       (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                  sVar28 = auVar54._4_2_;
                  sVar33 = auVar57._4_2_;
                  auVar56._4_2_ =
                       (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                  sVar28 = auVar54._6_2_;
                  sVar33 = auVar57._6_2_;
                  auVar56._6_2_ =
                       (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                  sVar28 = auVar54._8_2_;
                  sVar33 = auVar57._8_2_;
                  auVar56._8_2_ =
                       (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                  sVar28 = auVar54._10_2_;
                  sVar33 = auVar57._10_2_;
                  auVar56._10_2_ =
                       (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                  sVar28 = auVar54._12_2_;
                  sVar33 = auVar57._12_2_;
                  sVar46 = auVar57._14_2_;
                  auVar56._12_2_ =
                       (ushort)(sVar33 < sVar28) * sVar28 | (ushort)(sVar33 >= sVar28) * sVar33;
                  sVar28 = auVar54._14_2_;
                  auVar56._14_2_ =
                       (ushort)(sVar46 < sVar28) * sVar28 | (ushort)(sVar46 >= sVar28) * sVar46;
                  psVar2 = (short *)((long)*ptr_01 + lVar20);
                  sVar28 = *psVar2;
                  sVar33 = psVar2[1];
                  sVar46 = psVar2[2];
                  sVar48 = psVar2[3];
                  sVar49 = psVar2[4];
                  sVar50 = psVar2[5];
                  sVar51 = psVar2[6];
                  sVar52 = psVar2[7];
                  auVar45._0_2_ =
                       (sVar28 < (short)auVar56._0_2_) * auVar56._0_2_ |
                       (ushort)(sVar28 >= (short)auVar56._0_2_) * sVar28;
                  auVar45._2_2_ =
                       (sVar33 < (short)auVar56._2_2_) * auVar56._2_2_ |
                       (ushort)(sVar33 >= (short)auVar56._2_2_) * sVar33;
                  auVar45._4_2_ =
                       (sVar46 < (short)auVar56._4_2_) * auVar56._4_2_ |
                       (ushort)(sVar46 >= (short)auVar56._4_2_) * sVar46;
                  auVar45._6_2_ =
                       (sVar48 < (short)auVar56._6_2_) * auVar56._6_2_ |
                       (ushort)(sVar48 >= (short)auVar56._6_2_) * sVar48;
                  auVar45._8_2_ =
                       (sVar49 < (short)auVar56._8_2_) * auVar56._8_2_ |
                       (ushort)(sVar49 >= (short)auVar56._8_2_) * sVar49;
                  auVar45._10_2_ =
                       (sVar50 < (short)auVar56._10_2_) * auVar56._10_2_ |
                       (ushort)(sVar50 >= (short)auVar56._10_2_) * sVar50;
                  auVar45._12_2_ =
                       (sVar51 < (short)auVar56._12_2_) * auVar56._12_2_ |
                       (ushort)(sVar51 >= (short)auVar56._12_2_) * sVar51;
                  auVar45._14_2_ =
                       (sVar52 < (short)auVar56._14_2_) * auVar56._14_2_ |
                       (ushort)(sVar52 >= (short)auVar56._14_2_) * sVar52;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar20) = auVar45;
                  sVar28 = auVar34._0_2_;
                  auVar42._0_2_ =
                       ((short)auVar45._0_2_ < sVar28) * auVar45._0_2_ |
                       (ushort)((short)auVar45._0_2_ >= sVar28) * sVar28;
                  sVar28 = auVar34._2_2_;
                  auVar42._2_2_ =
                       ((short)auVar45._2_2_ < sVar28) * auVar45._2_2_ |
                       (ushort)((short)auVar45._2_2_ >= sVar28) * sVar28;
                  sVar28 = auVar34._4_2_;
                  auVar42._4_2_ =
                       ((short)auVar45._4_2_ < sVar28) * auVar45._4_2_ |
                       (ushort)((short)auVar45._4_2_ >= sVar28) * sVar28;
                  sVar28 = auVar34._6_2_;
                  auVar42._6_2_ =
                       ((short)auVar45._6_2_ < sVar28) * auVar45._6_2_ |
                       (ushort)((short)auVar45._6_2_ >= sVar28) * sVar28;
                  sVar28 = auVar34._8_2_;
                  auVar42._8_2_ =
                       ((short)auVar45._8_2_ < sVar28) * auVar45._8_2_ |
                       (ushort)((short)auVar45._8_2_ >= sVar28) * sVar28;
                  sVar28 = auVar34._10_2_;
                  auVar42._10_2_ =
                       ((short)auVar45._10_2_ < sVar28) * auVar45._10_2_ |
                       (ushort)((short)auVar45._10_2_ >= sVar28) * sVar28;
                  sVar28 = auVar34._12_2_;
                  sVar33 = auVar34._14_2_;
                  auVar42._12_2_ =
                       ((short)auVar45._12_2_ < sVar28) * auVar45._12_2_ |
                       (ushort)((short)auVar45._12_2_ >= sVar28) * sVar28;
                  auVar42._14_2_ =
                       ((short)auVar45._14_2_ < sVar33) * auVar45._14_2_ |
                       (ushort)((short)auVar45._14_2_ >= sVar33) * sVar33;
                  sVar28 = auVar38._0_2_;
                  auVar40._0_2_ =
                       (sVar28 < (short)auVar45._0_2_) * auVar45._0_2_ |
                       (ushort)(sVar28 >= (short)auVar45._0_2_) * sVar28;
                  sVar28 = auVar38._2_2_;
                  auVar40._2_2_ =
                       (sVar28 < (short)auVar45._2_2_) * auVar45._2_2_ |
                       (ushort)(sVar28 >= (short)auVar45._2_2_) * sVar28;
                  sVar28 = auVar38._4_2_;
                  auVar40._4_2_ =
                       (sVar28 < (short)auVar45._4_2_) * auVar45._4_2_ |
                       (ushort)(sVar28 >= (short)auVar45._4_2_) * sVar28;
                  sVar28 = auVar38._6_2_;
                  auVar40._6_2_ =
                       (sVar28 < (short)auVar45._6_2_) * auVar45._6_2_ |
                       (ushort)(sVar28 >= (short)auVar45._6_2_) * sVar28;
                  sVar28 = auVar38._8_2_;
                  auVar40._8_2_ =
                       (sVar28 < (short)auVar45._8_2_) * auVar45._8_2_ |
                       (ushort)(sVar28 >= (short)auVar45._8_2_) * sVar28;
                  sVar28 = auVar38._10_2_;
                  auVar40._10_2_ =
                       (sVar28 < (short)auVar45._10_2_) * auVar45._10_2_ |
                       (ushort)(sVar28 >= (short)auVar45._10_2_) * sVar28;
                  sVar28 = auVar38._12_2_;
                  sVar33 = auVar38._14_2_;
                  auVar40._12_2_ =
                       (sVar28 < (short)auVar45._12_2_) * auVar45._12_2_ |
                       (ushort)(sVar28 >= (short)auVar45._12_2_) * sVar28;
                  auVar40._14_2_ =
                       (sVar33 < (short)auVar45._14_2_) * auVar45._14_2_ |
                       (ushort)(sVar33 >= (short)auVar45._14_2_) * sVar33;
                  auVar38 = auVar40;
                  auVar34 = auVar42;
                }
              }
              alVar39 = ptr_02[(ulong)uVar21 % size];
              iVar14 = 0;
              while( true ) {
                uVar25 = alVar39[0];
                lVar20 = alVar39[1];
                if (7 - (int)(uVar21 / size) <= iVar14) break;
                alVar39[0] = uVar25 << 0x10;
                alVar39[1] = lVar20 << 0x10 | uVar25 >> 0x30;
                iVar14 = iVar14 + 1;
              }
              sVar28 = auVar30._0_2_;
              auVar32._0_2_ = -(ushort)(auVar34._0_2_ < sVar28);
              sVar33 = auVar30._2_2_;
              auVar32._2_2_ = -(ushort)(auVar34._2_2_ < sVar33);
              auVar32._4_2_ = -(ushort)(auVar34._4_2_ < sVar28);
              auVar32._6_2_ = -(ushort)(auVar34._6_2_ < sVar33);
              auVar32._8_2_ = -(ushort)(auVar34._8_2_ < sVar28);
              auVar32._10_2_ = -(ushort)(auVar34._10_2_ < sVar33);
              auVar32._12_2_ = -(ushort)(auVar34._12_2_ < sVar28);
              auVar32._14_2_ = -(ushort)(auVar34._14_2_ < sVar33);
              sVar28 = auVar35._0_2_;
              auVar41._0_2_ = -(ushort)(sVar28 < auVar38._0_2_);
              sVar33 = auVar35._2_2_;
              auVar41._2_2_ = -(ushort)(sVar33 < auVar38._2_2_);
              auVar41._4_2_ = -(ushort)(sVar28 < auVar38._4_2_);
              auVar41._6_2_ = -(ushort)(sVar33 < auVar38._6_2_);
              auVar41._8_2_ = -(ushort)(sVar28 < auVar38._8_2_);
              auVar41._10_2_ = -(ushort)(sVar33 < auVar38._10_2_);
              auVar41._12_2_ = -(ushort)(sVar28 < auVar38._12_2_);
              auVar41._14_2_ = -(ushort)(sVar33 < auVar38._14_2_);
              auVar41 = auVar41 | auVar32;
              if ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar41 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar41 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar41 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar41 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar41 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar41 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar41 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar41 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar41 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar41 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar41 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar41[0xf]) {
                sVar28 = alVar39[1]._6_2_;
              }
              else {
                *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                sVar28 = 0;
                iVar11 = 0;
                uVar21 = 0;
              }
              ppVar10->score = (int)sVar28;
              ppVar10->end_query = uVar21;
              ppVar10->end_ref = iVar11;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar10;
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar16 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_scan_profile_sse2_128_16",pcVar16);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}